

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdns_handler.cpp
# Opt level: O1

int ot::commissioner::HandleRecord
              (sockaddr *aFrom,mdns_entry_type_t aEntry,uint16_t aType,uint16_t aRclass,
              uint32_t aTtl,void *aData,size_t aSize,size_t aOffset,size_t aLength,
              void *aBorderAgent)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  ushort uVar3;
  undefined4 uVar4;
  unsigned_short uVar5;
  int iVar6;
  uint uVar7;
  size_t sVar8;
  ulong uVar9;
  unsigned_long uVar10;
  Timestamp TVar11;
  time_t tVar12;
  char *pcVar13;
  ByteArray *extraout_RDX;
  ByteArray *extraout_RDX_00;
  ByteArray *extraout_RDX_01;
  ByteArray *extraout_RDX_02;
  ushort uVar14;
  ushort uVar15;
  ushort uVar16;
  ByteArray *extraout_RDX_03;
  ByteArray *extraout_RDX_04;
  ByteArray *pBVar17;
  ByteArray *aBytes;
  ByteArray *aBytes_00;
  ByteArray *aBytes_01;
  ByteArray *aBytes_02;
  ByteArray *aBytes_03;
  ByteArray *aBytes_04;
  long lVar18;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  aVar19;
  char *pcVar20;
  char *pcVar21;
  bool bVar22;
  bool bVar23;
  mdns_string_t mVar24;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  string_view fmt_04;
  string_view fmt_05;
  string_view fmt_06;
  string_view fmt_07;
  string_view fmt_08;
  string_view fmt_09;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  format_args args_05;
  format_args args_06;
  format_args args_07;
  format_args args_08;
  format_args args_09;
  format_args args_10;
  writer write_1;
  ByteArray binaryValue;
  string value;
  writer write;
  string fromAddrStr;
  Address fromAddr;
  string entryType;
  char nameBuffer [256];
  sockaddr_storage fromAddrStorage;
  mdns_record_srv_t server;
  undefined1 local_1370 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1360;
  byte local_1349;
  string local_1348;
  undefined1 local_1328 [8];
  char *pcStack_1320;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1318;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1308;
  code *local_1300;
  code *local_12f8;
  string *local_12f0;
  undefined1 local_12e8 [8];
  char *pcStack_12e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_12d8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_12c0;
  string local_12a8;
  writer local_1288;
  undefined8 local_1280;
  undefined1 local_1278 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1268;
  char *pcStack_1260;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1258;
  Address local_1248;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_1230;
  string *local_1228;
  string *local_1220;
  string *local_1218;
  string *local_1210;
  string *local_1208;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_1200;
  long local_11f8;
  string *local_11f0;
  size_t local_11e8;
  ulong local_11e0;
  undefined1 *local_11d8;
  char *local_11d0;
  undefined1 local_11c8 [16];
  char local_11b8 [256];
  sockaddr_storage local_10b8;
  undefined1 local_1038 [24];
  long lStack_1020;
  format_string_checker<char> *local_1018;
  parse_func local_1010 [1];
  
  local_1248.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1248.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1248.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1268 = &local_1258;
  pcStack_1260 = (char *)0x0;
  local_1258._M_local_buf[0] = '\0';
  local_11d8 = local_11c8;
  local_11d0 = (char *)0x0;
  local_11c8[0] = 0;
  local_10b8.ss_family = aFrom->sa_family;
  local_10b8.__ss_padding[0] = aFrom->sa_data[0];
  local_10b8.__ss_padding[1] = aFrom->sa_data[1];
  local_10b8.__ss_padding[2] = aFrom->sa_data[2];
  local_10b8.__ss_padding[3] = aFrom->sa_data[3];
  local_10b8.__ss_padding[4] = aFrom->sa_data[4];
  local_10b8.__ss_padding[5] = aFrom->sa_data[5];
  local_10b8.__ss_padding._6_8_ = *(undefined8 *)(aFrom->sa_data + 6);
  aVar19 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
            )aData;
  Address::Set((Error *)local_1038,&local_1248,&local_10b8);
  uVar4 = local_1038._0_4_;
  if ((long *)CONCAT44(local_1038._12_4_,local_1038._8_4_) != &lStack_1020) {
    operator_delete((long *)CONCAT44(local_1038._12_4_,local_1038._8_4_));
  }
  if (uVar4 != none_type) {
    local_1038._0_8_ = local_1038._0_8_ & 0xffffffff00000000;
    pcVar20 = "invalid source address of mDNS response";
    local_1038._8_4_ = 0x30460b;
    local_1038._12_4_ = 0;
    local_1038._16_4_ = 0x27;
    local_1038._20_4_ = 0;
    lStack_1020._0_4_ = 0;
    lStack_1020._4_4_ = 0;
    local_1010[0] = (parse_func)0x0;
    local_1288.handler_ = (format_string_checker<char> *)local_1038;
    local_1018 = (format_string_checker<char> *)local_1038;
    do {
      if (pcVar20 == "") break;
      pcVar13 = pcVar20;
      if (*pcVar20 == '{') {
LAB_00284e5a:
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
        operator()(&local_1288,pcVar20,pcVar13);
        pcVar20 = ::fmt::v10::detail::
                  parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                            (pcVar13,"",(format_string_checker<char> *)local_1038);
        bVar22 = true;
      }
      else {
        pcVar13 = pcVar20 + 1;
        bVar22 = pcVar13 != "";
        if (bVar22) {
          if (*pcVar13 != '{') {
            pcVar21 = pcVar20 + 2;
            do {
              pcVar13 = pcVar21;
              bVar22 = pcVar13 != "";
              if (pcVar13 == "") goto LAB_00284e56;
              pcVar21 = pcVar13 + 1;
            } while (*pcVar13 != '{');
          }
          bVar22 = true;
        }
LAB_00284e56:
        if (bVar22) goto LAB_00284e5a;
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
        operator()(&local_1288,pcVar20,"");
        bVar22 = false;
      }
    } while (bVar22);
    args.field_1.values_ = aVar19.values_;
    args.desc_ = (unsigned_long_long)local_1038;
    ::fmt::v10::vformat_abi_cxx11_
              ((string *)local_12e8,(v10 *)"invalid source address of mDNS response",
               (string_view)ZEXT816(0x27),args);
    local_1328._0_4_ = 8;
    pcStack_1320 = local_1318._M_local_buf + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pcStack_1320,local_12e8,pcStack_12e0 + (long)local_12e8);
    *(undefined4 *)((long)aBorderAgent + 0x178) = local_1328._0_4_;
    std::__cxx11::string::operator=((string *)((long)aBorderAgent + 0x180),(string *)&pcStack_1320);
    if (pcStack_1320 != local_1318._M_local_buf + 8) {
      operator_delete(pcStack_1320);
    }
    if (local_12e8 != (undefined1  [8])&local_12d8) {
      operator_delete((void *)local_12e8);
    }
    goto LAB_00286732;
  }
  Address::ToString_abi_cxx11_((string *)local_1038,&local_1248);
  std::__cxx11::string::operator=((string *)&local_1268,(string *)local_1038);
  paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_1038 + 0x10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1038._0_8_ != paVar1) {
    operator_delete((void *)local_1038._0_8_);
  }
  pcVar20 = local_11d0;
  pcVar13 = "additional";
  if (aEntry == MDNS_ENTRYTYPE_AUTHORITY) {
    pcVar13 = "authority";
  }
  pcVar21 = "answer";
  if (aEntry != MDNS_ENTRYTYPE_ANSWER) {
    pcVar21 = pcVar13;
  }
  strlen(pcVar21);
  std::__cxx11::string::_M_replace((ulong)&local_11d8,0,pcVar20,(ulong)pcVar21);
  if (aType < 0x10) {
    if (aType == 1) {
      local_1288.handler_ = (format_string_checker<char> *)local_1278;
      local_1280 = 0;
      local_1278[0] = none_type;
      mdns_record_parse_a(aData,aSize,aOffset,aLength,(sockaddr_in *)local_1370);
      local_1038._0_8_ = local_1370._0_8_;
      local_1038._8_4_ = local_1370._8_4_;
      local_1038._12_4_ = local_1370._12_4_;
      Address::Set((Error *)local_1328,&local_1248,(sockaddr_storage *)local_1038);
      iVar6 = local_1328._0_4_;
      if (pcStack_1320 != local_1318._M_local_buf + 8) {
        operator_delete(pcStack_1320);
      }
      if (iVar6 == 0) {
        Address::ToString_abi_cxx11_((string *)local_1328,&local_1248);
        std::__cxx11::string::operator=((string *)&local_1288,(string *)local_1328);
        if (local_1328 != (undefined1  [8])&local_1318) {
          operator_delete((void *)local_1328);
        }
        if ((*(byte *)((long)aBorderAgent + 0x170) & 1) == 0) {
          std::__cxx11::string::_M_assign((string *)((long)aBorderAgent + 8));
          goto LAB_002866df;
        }
      }
      else {
        local_1328._0_4_ = 0xd;
        pcVar20 = "invalid IPv4 address in A record from {}";
        pcStack_1320 = "invalid IPv4 address in A record from {}";
        local_1318._M_allocated_capacity = 0x28;
        local_1318._8_8_ = (char *)0x100000000;
        local_1300 = ::fmt::v10::detail::
                     parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
        ;
        local_1348._M_dataplus._M_p = (pointer)local_1328;
        local_1308 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_1328;
        do {
          if (pcVar20 == "") break;
          pcVar13 = pcVar20;
          if (*pcVar20 == '{') {
LAB_00286532:
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::writer::operator()((writer *)&local_1348,pcVar20,pcVar13);
            pcVar20 = ::fmt::v10::detail::
                      parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                                (pcVar13,"",
                                 (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)local_1328);
            bVar22 = true;
          }
          else {
            pcVar13 = pcVar20 + 1;
            bVar22 = pcVar13 != "";
            if (bVar22) {
              if (*pcVar13 != '{') {
                pcVar21 = pcVar20 + 2;
                do {
                  pcVar13 = pcVar21;
                  bVar22 = pcVar13 != "";
                  if (pcVar13 == "") goto LAB_0028652e;
                  pcVar21 = pcVar13 + 1;
                } while (*pcVar13 != '{');
              }
              bVar22 = true;
            }
LAB_0028652e:
            if (bVar22) goto LAB_00286532;
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::writer::operator()((writer *)&local_1348,pcVar20,"");
            bVar22 = false;
          }
        } while (bVar22);
        local_1328 = (undefined1  [8])local_1268;
        pcStack_1320 = pcStack_1260;
        fmt_09.size_ = 0xd;
        fmt_09.data_ = (char *)0x28;
        args_10.field_1.args_ = aVar19.args_;
        args_10.desc_ = (unsigned_long_long)local_1328;
        ::fmt::v10::vformat_abi_cxx11_
                  (&local_12a8,(v10 *)"invalid IPv4 address in A record from {}",fmt_09,args_10);
        local_12e8._0_4_ = 8;
        pcStack_12e0 = local_12d8._M_local_buf + 8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&pcStack_12e0,local_12a8._M_dataplus._M_p,
                   (char *)(local_12a8._M_string_length + (long)local_12a8._M_dataplus._M_p));
LAB_002865d9:
        *(undefined4 *)((long)aBorderAgent + 0x178) = local_12e8._0_4_;
        std::__cxx11::string::operator=
                  ((string *)((long)aBorderAgent + 0x180),(string *)&pcStack_12e0);
        if (pcStack_12e0 != local_12d8._M_local_buf + 8) {
          operator_delete(pcStack_12e0);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_12a8._M_dataplus._M_p != &local_12a8.field_2) {
          operator_delete(local_12a8._M_dataplus._M_p);
        }
      }
LAB_002866ee:
      if (local_1288.handler_ != (format_string_checker<char> *)local_1278) {
        operator_delete(local_1288.handler_);
      }
      if (iVar6 != 0) goto LAB_00286732;
    }
    else if (aType == 0xc) {
      mVar24 = mdns_record_parse_ptr(aData,aSize,aOffset,aLength,local_11b8,0x100);
      local_1038._0_8_ = paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1038,mVar24.str,mVar24.str + mVar24.length);
      std::__cxx11::string::operator=((string *)((long)aBorderAgent + 0x148),(string *)local_1038);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1038._0_8_ != paVar1) {
        operator_delete((void *)local_1038._0_8_);
      }
      *(undefined4 *)((long)aBorderAgent + 0x170) = 0x10000;
    }
  }
  else if (aType == 0x10) {
    aVar19 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
              )0x80;
    sVar8 = mdns_record_parse_txt(aData,aSize,aOffset,aLength,(mdns_record_txt_t *)local_1038,0x80);
    bVar22 = sVar8 != 0;
    if (bVar22) {
      local_12f0 = (string *)((long)aBorderAgent + 0x180);
      local_1228 = (string *)((long)aBorderAgent + 0x120);
      local_1230 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   ((long)aBorderAgent + 0x108);
      local_1220 = (string *)((long)aBorderAgent + 0xe8);
      local_1218 = (string *)((long)aBorderAgent + 0xb8);
      local_1210 = (string *)((long)aBorderAgent + 0x98);
      local_1208 = (string *)((long)aBorderAgent + 0x70);
      local_11f0 = (string *)((long)aBorderAgent + 0x48);
      local_1200 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   ((long)aBorderAgent + 0x30);
      uVar9 = 0;
      local_11e8 = sVar8;
      do {
        local_1288.handler_ = (format_string_checker<char> *)local_1278;
        lVar18 = uVar9 * 0x20;
        local_1349 = bVar22;
        local_11e0 = uVar9;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1288,*(long *)(local_1038 + lVar18),
                   *(long *)(local_1038 + lVar18 + 8) + *(long *)(local_1038 + lVar18));
        local_12a8._M_dataplus._M_p = (pointer)&local_12a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_12a8,*(long *)(local_1038 + lVar18 + 0x10),
                   (&lStack_1020)[uVar9 * 4] + *(long *)(local_1038 + lVar18 + 0x10));
        std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<char_const*,void>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_12c0,
                   *(char **)(local_1038 + lVar18 + 0x10),
                   *(char **)(local_1038 + lVar18 + 0x10) + (&lStack_1020)[uVar9 * 4],
                   (allocator_type *)
                   ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1328)->_M_local_buf);
        iVar6 = std::__cxx11::string::compare((char *)&local_1288);
        if (iVar6 == 0) {
          iVar6 = std::__cxx11::string::compare((char *)&local_12a8);
          if (iVar6 != 0) {
            local_1328 = (undefined1  [8])0xd0000000d;
            pcVar20 = "value of TXT Key \'rv\' is {} but not 1 from {}";
            pcStack_1320 = "value of TXT Key \'rv\' is {} but not 1 from {}";
            local_1318._M_allocated_capacity = 0x2d;
            local_1318._8_8_ = 0x200000000;
            local_1300 = ::fmt::v10::detail::
                         parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
            ;
            local_12f8 = ::fmt::v10::detail::
                         parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
            ;
            local_1348._M_dataplus._M_p = (pointer)local_1328;
            local_1308 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)local_1328;
            do {
              if (pcVar20 == "") break;
              pcVar13 = pcVar20;
              if (*pcVar20 == '{') {
LAB_0028547f:
                ::fmt::v10::detail::
                parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::writer::operator()((writer *)&local_1348,pcVar20,pcVar13);
                pcVar20 = ::fmt::v10::detail::
                          parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string,std::__cxx11::string>&>
                                    (pcVar13,"",
                                     (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)local_1328);
                bVar22 = true;
              }
              else {
                pcVar13 = pcVar20 + 1;
                bVar22 = pcVar13 != "";
                if (bVar22) {
                  if (*pcVar13 != '{') {
                    pcVar21 = pcVar20 + 2;
                    do {
                      pcVar13 = pcVar21;
                      bVar22 = pcVar13 != "";
                      if (pcVar13 == "") goto LAB_0028547b;
                      pcVar21 = pcVar13 + 1;
                    } while (*pcVar13 != '{');
                  }
                  bVar22 = true;
                }
LAB_0028547b:
                if (bVar22) goto LAB_0028547f;
                ::fmt::v10::detail::
                parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::writer::operator()((writer *)&local_1348,pcVar20,"");
                bVar22 = false;
              }
            } while (bVar22);
            local_1328 = (undefined1  [8])local_12a8._M_dataplus._M_p;
            pcStack_1320 = (char *)local_12a8._M_string_length;
            local_1318._M_allocated_capacity = (size_type)local_1268;
            local_1318._8_8_ = pcStack_1260;
            fmt.size_ = 0xdd;
            fmt.data_ = (char *)0x2d;
            args_00.field_1.args_ = aVar19.args_;
            args_00.desc_ = (unsigned_long_long)local_1328;
            ::fmt::v10::vformat_abi_cxx11_
                      ((string *)local_1370,(v10 *)"value of TXT Key \'rv\' is {} but not 1 from {}"
                       ,fmt,args_00);
            local_12e8._0_4_ = 8;
            pcStack_12e0 = local_12d8._M_local_buf + 8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&pcStack_12e0,local_1370._0_8_,
                       (char *)(local_1370._0_8_ + CONCAT44(local_1370._12_4_,local_1370._8_4_)));
            *(undefined4 *)((long)aBorderAgent + 0x178) = local_12e8._0_4_;
            std::__cxx11::string::operator=(local_12f0,(string *)&pcStack_12e0);
            if (pcStack_12e0 != local_12d8._M_local_buf + 8) {
              operator_delete(pcStack_12e0);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1370._0_8_ != &local_1360) {
              operator_delete((void *)local_1370._0_8_);
            }
            bVar22 = true;
            goto LAB_00285c02;
          }
LAB_00285bff:
          bVar22 = false;
        }
        else {
          iVar6 = std::__cxx11::string::compare((char *)&local_1288);
          if (iVar6 == 0) {
            lVar18 = (long)local_12c0.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)local_12c0.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start;
            if (lVar18 == 8) {
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                        (local_1200,&local_12c0);
              *(byte *)((long)aBorderAgent + 0x171) = *(byte *)((long)aBorderAgent + 0x171) | 0x80;
              bVar22 = false;
            }
            else {
              local_1328._0_4_ = 0xd;
              pcVar20 = "value of TXT Key \'dd\' is invalid: value={}";
              pcStack_1320 = "value of TXT Key \'dd\' is invalid: value={}";
              local_1318._M_allocated_capacity = 0x2a;
              local_1318._8_8_ = (char *)0x100000000;
              local_1300 = ::fmt::v10::detail::
                           parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
              ;
              pBVar17 = extraout_RDX;
              local_1348._M_dataplus._M_p = (pointer)local_1328;
              local_1308 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)local_1328;
              do {
                if (pcVar20 == "") break;
                pcVar13 = pcVar20;
                if (*pcVar20 == '{') {
LAB_00285699:
                  ::fmt::v10::detail::
                  parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::writer::operator()((writer *)&local_1348,pcVar20,pcVar13);
                  pcVar20 = ::fmt::v10::detail::
                            parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                                      (pcVar13,"",
                                       (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)local_1328);
                  bVar22 = true;
                  pBVar17 = extraout_RDX_01;
                }
                else {
                  pcVar13 = pcVar20 + 1;
                  bVar22 = pcVar13 != "";
                  if (bVar22) {
                    if (*pcVar13 != '{') {
                      pcVar21 = pcVar20 + 2;
                      do {
                        pcVar13 = pcVar21;
                        bVar22 = pcVar13 != "";
                        if (pcVar13 == "") goto LAB_00285695;
                        pcVar21 = pcVar13 + 1;
                      } while (*pcVar13 != '{');
                    }
                    bVar22 = true;
                  }
LAB_00285695:
                  if (bVar22) goto LAB_00285699;
                  ::fmt::v10::detail::
                  parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::writer::operator()((writer *)&local_1348,pcVar20,"");
                  bVar22 = false;
                  pBVar17 = extraout_RDX_02;
                }
              } while (bVar22);
              utils::Hex_abi_cxx11_((string *)local_1328,(utils *)&local_12c0,pBVar17);
              local_1348._M_dataplus._M_p = (pointer)local_1328;
              local_1348._M_string_length = (size_type)pcStack_1320;
              fmt_00.size_ = 0xd;
              fmt_00.data_ = (char *)0x2a;
              args_01.field_1.args_ = aVar19.args_;
              args_01.desc_ = (unsigned_long_long)&local_1348;
              ::fmt::v10::vformat_abi_cxx11_
                        ((string *)local_1370,(v10 *)"value of TXT Key \'dd\' is invalid: value={}",
                         fmt_00,args_01);
              local_12e8._0_4_ = 8;
              pcStack_12e0 = local_12d8._M_local_buf + 8;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&pcStack_12e0,local_1370._0_8_,
                         (char *)(local_1370._0_8_ + CONCAT44(local_1370._12_4_,local_1370._8_4_)));
              *(undefined4 *)((long)aBorderAgent + 0x178) = local_12e8._0_4_;
              std::__cxx11::string::operator=(local_12f0,(string *)&pcStack_12e0);
              if (pcStack_12e0 != local_12d8._M_local_buf + 8) {
                operator_delete(pcStack_12e0);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1370._0_8_ != &local_1360) {
                operator_delete((void *)local_1370._0_8_);
              }
              if (local_1328 != (undefined1  [8])&local_1318) {
                operator_delete((void *)local_1328);
              }
              bVar22 = true;
            }
            bVar23 = lVar18 == 8;
            goto LAB_002857bb;
          }
          iVar6 = std::__cxx11::string::compare((char *)&local_1288);
          if (iVar6 == 0) {
            uVar7 = 4;
            std::__cxx11::string::_M_assign(local_11f0);
LAB_00285bee:
            *(uint *)((long)aBorderAgent + 0x170) = *(uint *)((long)aBorderAgent + 0x170) | uVar7;
            goto LAB_00285bff;
          }
          iVar6 = std::__cxx11::string::compare((char *)&local_1288);
          if (iVar6 != 0) {
            iVar6 = std::__cxx11::string::compare((char *)&local_1288);
            if (iVar6 == 0) {
              uVar7 = 0x10;
              std::__cxx11::string::_M_assign(local_1208);
            }
            else {
              iVar6 = std::__cxx11::string::compare((char *)&local_1288);
              if (iVar6 == 0) {
                lVar18 = (long)local_12c0.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_12c0.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start;
                if (lVar18 == 8) {
                  uVar10 = utils::Decode<unsigned_long>
                                     (local_12c0.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start,8);
                  *(unsigned_long *)((long)aBorderAgent + 0x90) = uVar10;
                  *(byte *)((long)aBorderAgent + 0x170) =
                       *(byte *)((long)aBorderAgent + 0x170) | 0x20;
                  bVar22 = false;
                }
                else {
                  ::fmt::v10::detail::
                  check_format_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                            ();
                  utils::Hex_abi_cxx11_(&local_1348,(utils *)&local_12c0,aBytes);
                  local_12e8 = (undefined1  [8])local_1348._M_dataplus._M_p;
                  pcStack_12e0 = (char *)local_1348._M_string_length;
                  local_12d8._M_allocated_capacity = (size_type)local_1268;
                  local_12d8._8_8_ = pcStack_1260;
                  fmt_02.size_ = 0xdd;
                  fmt_02.data_ = (char *)0x32;
                  args_03.field_1.args_ = aVar19.args_;
                  args_03.desc_ = (unsigned_long_long)local_12e8;
                  ::fmt::v10::vformat_abi_cxx11_
                            ((string *)local_1370,
                             (v10 *)"value of TXT Key \'xp\' is invalid: value={} from {}",fmt_02,
                             args_03);
                  local_1328._0_4_ = 8;
                  pcStack_1320 = local_1318._M_local_buf + 8;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&pcStack_1320,local_1370._0_8_,
                             (char *)(local_1370._0_8_ +
                                     CONCAT44(local_1370._12_4_,local_1370._8_4_)));
                  *(undefined4 *)((long)aBorderAgent + 0x178) = local_1328._0_4_;
                  std::__cxx11::string::operator=(local_12f0,(string *)&pcStack_1320);
                  if (pcStack_1320 != local_1318._M_local_buf + 8) {
                    operator_delete(pcStack_1320);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1370._0_8_ != &local_1360) {
                    operator_delete((void *)local_1370._0_8_);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1348._M_dataplus._M_p != &local_1348.field_2) {
                    operator_delete(local_1348._M_dataplus._M_p);
                  }
                  bVar22 = true;
                }
                bVar23 = lVar18 == 8;
LAB_00285bc8:
                if (bVar23) goto LAB_00285bff;
                goto LAB_00285c02;
              }
              iVar6 = std::__cxx11::string::compare((char *)&local_1288);
              if (iVar6 == 0) {
                uVar7 = 0x40;
                std::__cxx11::string::_M_assign(local_1210);
              }
              else {
                iVar6 = std::__cxx11::string::compare((char *)&local_1288);
                if (iVar6 == 0) {
                  uVar7 = 0x80;
                  std::__cxx11::string::_M_assign(local_1218);
                }
                else {
                  iVar6 = std::__cxx11::string::compare((char *)&local_1288);
                  if (iVar6 == 0) {
                    lVar18 = (long)local_12c0.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_12c0.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start;
                    if (lVar18 == 8) {
                      uVar10 = utils::Decode<unsigned_long>
                                         (local_12c0.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_start,8);
                      TVar11 = Timestamp::Decode(uVar10);
                      *(Timestamp *)((long)aBorderAgent + 0xd8) = TVar11;
                      *(byte *)((long)aBorderAgent + 0x171) =
                           *(byte *)((long)aBorderAgent + 0x171) | 1;
                      bVar22 = false;
                    }
                    else {
                      ::fmt::v10::detail::
                      check_format_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                                ();
                      utils::Hex_abi_cxx11_(&local_1348,(utils *)&local_12c0,aBytes_00);
                      local_12e8 = (undefined1  [8])local_1348._M_dataplus._M_p;
                      pcStack_12e0 = (char *)local_1348._M_string_length;
                      local_12d8._M_allocated_capacity = (size_type)local_1268;
                      local_12d8._8_8_ = pcStack_1260;
                      fmt_03.size_ = 0xdd;
                      fmt_03.data_ = (char *)0x32;
                      args_04.field_1.args_ = aVar19.args_;
                      args_04.desc_ = (unsigned_long_long)local_12e8;
                      ::fmt::v10::vformat_abi_cxx11_
                                ((string *)local_1370,
                                 (v10 *)"value of TXT Key \'at\' is invalid: value={} from {}",
                                 fmt_03,args_04);
                      local_1328._0_4_ = 8;
                      pcStack_1320 = local_1318._M_local_buf + 8;
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)&pcStack_1320,local_1370._0_8_,
                                 (char *)(local_1370._0_8_ +
                                         CONCAT44(local_1370._12_4_,local_1370._8_4_)));
                      *(undefined4 *)((long)aBorderAgent + 0x178) = local_1328._0_4_;
                      std::__cxx11::string::operator=(local_12f0,(string *)&pcStack_1320);
                      if (pcStack_1320 != local_1318._M_local_buf + 8) {
                        operator_delete(pcStack_1320);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_1370._0_8_ != &local_1360) {
                        operator_delete((void *)local_1370._0_8_);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_1348._M_dataplus._M_p != &local_1348.field_2) {
                        operator_delete(local_1348._M_dataplus._M_p);
                      }
                      bVar22 = true;
                    }
                    if (lVar18 == 8) goto LAB_00285bff;
                    goto LAB_00285c02;
                  }
                  iVar6 = std::__cxx11::string::compare((char *)&local_1288);
                  if (iVar6 == 0) {
                    lVar18 = (long)local_12c0.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_12c0.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start;
                    if (lVar18 == 4) {
                      uVar7 = utils::Decode<unsigned_int>
                                        (local_12c0.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start,4);
                      *(uint *)((long)aBorderAgent + 0xe0) = uVar7;
                      *(byte *)((long)aBorderAgent + 0x171) =
                           *(byte *)((long)aBorderAgent + 0x171) | 2;
                      bVar22 = false;
                    }
                    else {
                      ::fmt::v10::detail::
                      check_format_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                                ();
                      utils::Hex_abi_cxx11_(&local_1348,(utils *)&local_12c0,aBytes_01);
                      local_12e8 = (undefined1  [8])local_1348._M_dataplus._M_p;
                      pcStack_12e0 = (char *)local_1348._M_string_length;
                      local_12d8._M_allocated_capacity = (size_type)local_1268;
                      local_12d8._8_8_ = pcStack_1260;
                      fmt_04.size_ = 0xdd;
                      fmt_04.data_ = (char *)0x32;
                      args_05.field_1.args_ = aVar19.args_;
                      args_05.desc_ = (unsigned_long_long)local_12e8;
                      ::fmt::v10::vformat_abi_cxx11_
                                ((string *)local_1370,
                                 (v10 *)"value of TXT Key \'pt\' is invalid: value={} from {}",
                                 fmt_04,args_05);
                      local_1328._0_4_ = 8;
                      pcStack_1320 = local_1318._M_local_buf + 8;
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)&pcStack_1320,local_1370._0_8_,
                                 (char *)(local_1370._0_8_ +
                                         CONCAT44(local_1370._12_4_,local_1370._8_4_)));
                      *(undefined4 *)((long)aBorderAgent + 0x178) = local_1328._0_4_;
                      std::__cxx11::string::operator=(local_12f0,(string *)&pcStack_1320);
                      if (pcStack_1320 != local_1318._M_local_buf + 8) {
                        operator_delete(pcStack_1320);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_1370._0_8_ != &local_1360) {
                        operator_delete((void *)local_1370._0_8_);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_1348._M_dataplus._M_p != &local_1348.field_2) {
                        operator_delete(local_1348._M_dataplus._M_p);
                      }
                      bVar22 = true;
                    }
                    bVar23 = lVar18 == 4;
                    goto LAB_00285bc8;
                  }
                  iVar6 = std::__cxx11::string::compare((char *)&local_1288);
                  if (iVar6 != 0) {
                    iVar6 = std::__cxx11::string::compare((char *)&local_1288);
                    if (iVar6 == 0) {
                      lVar18 = (long)local_12c0.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_12c0.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start;
                      if (lVar18 == 3) {
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                                  (local_1230,&local_12c0);
                        *(byte *)((long)aBorderAgent + 0x171) =
                             *(byte *)((long)aBorderAgent + 0x171) | 8;
                        bVar22 = false;
                      }
                      else {
                        ::fmt::v10::detail::
                        check_format_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                                  ();
                        utils::Hex_abi_cxx11_(&local_1348,(utils *)&local_12c0,aBytes_02);
                        local_12e8 = (undefined1  [8])local_1348._M_dataplus._M_p;
                        pcStack_12e0 = (char *)local_1348._M_string_length;
                        local_12d8._M_allocated_capacity = (size_type)local_1268;
                        local_12d8._8_8_ = pcStack_1260;
                        fmt_05.size_ = 0xdd;
                        fmt_05.data_ = (char *)0x32;
                        args_06.field_1.args_ = aVar19.args_;
                        args_06.desc_ = (unsigned_long_long)local_12e8;
                        ::fmt::v10::vformat_abi_cxx11_
                                  ((string *)local_1370,
                                   (v10 *)"value of TXT Key \'vo\' is invalid: value={} from {}",
                                   fmt_05,args_06);
                        local_1328._0_4_ = 8;
                        pcStack_1320 = local_1318._M_local_buf + 8;
                        std::__cxx11::string::_M_construct<char*>
                                  ((string *)&pcStack_1320,local_1370._0_8_,
                                   (char *)(local_1370._0_8_ +
                                           CONCAT44(local_1370._12_4_,local_1370._8_4_)));
                        *(undefined4 *)((long)aBorderAgent + 0x178) = local_1328._0_4_;
                        std::__cxx11::string::operator=(local_12f0,(string *)&pcStack_1320);
                        if (pcStack_1320 != local_1318._M_local_buf + 8) {
                          operator_delete(pcStack_1320);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_1370._0_8_ != &local_1360) {
                          operator_delete((void *)local_1370._0_8_);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_1348._M_dataplus._M_p != &local_1348.field_2) {
                          operator_delete(local_1348._M_dataplus._M_p);
                        }
                        bVar22 = true;
                      }
                      bVar23 = lVar18 == 3;
                    }
                    else {
                      iVar6 = std::__cxx11::string::compare((char *)&local_1288);
                      if (iVar6 == 0) {
                        uVar7 = 0x1000;
                        std::__cxx11::string::_M_assign(local_1228);
                        goto LAB_00285bee;
                      }
                      iVar6 = std::__cxx11::string::compare((char *)&local_1288);
                      if (iVar6 != 0) {
                        iVar6 = std::__cxx11::string::compare((char *)&local_1288);
                        if (iVar6 != 0) goto LAB_00285bff;
                        lVar18 = (long)local_12c0.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_12c0.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start;
                        if (lVar18 == 2) {
                          uVar5 = utils::Decode<unsigned_short>
                                            (local_12c0.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start,2);
                          *(unsigned_short *)((long)aBorderAgent + 0x142) = uVar5;
                          *(byte *)((long)aBorderAgent + 0x171) =
                               *(byte *)((long)aBorderAgent + 0x171) | 0x40;
                          bVar22 = false;
                        }
                        else {
                          ::fmt::v10::detail::
                          check_format_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                                    ();
                          utils::Hex_abi_cxx11_(&local_1348,(utils *)&local_12c0,aBytes_04);
                          local_12e8 = (undefined1  [8])local_1348._M_dataplus._M_p;
                          pcStack_12e0 = (char *)local_1348._M_string_length;
                          local_12d8._M_allocated_capacity = (size_type)local_1268;
                          local_12d8._8_8_ = pcStack_1260;
                          fmt_07.size_ = 0xdd;
                          fmt_07.data_ = (char *)0x33;
                          args_08.field_1.args_ = aVar19.args_;
                          args_08.desc_ = (unsigned_long_long)local_12e8;
                          ::fmt::v10::vformat_abi_cxx11_
                                    ((string *)local_1370,
                                     (v10 *)"[mDNS] value of TXT Key \'bb\' is invalid: {} from {}",
                                     fmt_07,args_08);
                          local_1328._0_4_ = 8;
                          pcStack_1320 = local_1318._M_local_buf + 8;
                          std::__cxx11::string::_M_construct<char*>
                                    ((string *)&pcStack_1320,local_1370._0_8_,
                                     (char *)(local_1370._0_8_ +
                                             CONCAT44(local_1370._12_4_,local_1370._8_4_)));
                          *(undefined4 *)((long)aBorderAgent + 0x178) = local_1328._0_4_;
                          std::__cxx11::string::operator=(local_12f0,(string *)&pcStack_1320);
                          if (pcStack_1320 != local_1318._M_local_buf + 8) {
                            operator_delete(pcStack_1320);
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_1370._0_8_ != &local_1360) {
                            operator_delete((void *)local_1370._0_8_);
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_1348._M_dataplus._M_p != &local_1348.field_2) {
                            operator_delete(local_1348._M_dataplus._M_p);
                          }
                          bVar22 = true;
                        }
                        bVar23 = lVar18 == 2;
                        goto LAB_00285bc8;
                      }
                      lVar18 = (long)local_12c0.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_12c0.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start;
                      if (lVar18 == 1) {
                        if (local_12c0.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish ==
                            local_12c0.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start) {
                          __assert_fail("condition",
                                        "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/common/utils.hpp"
                                        ,0xa2,
                                        "T ot::commissioner::utils::Decode(const uint8_t *, size_t) [T = unsigned char]"
                                       );
                        }
                        *(uchar *)((long)aBorderAgent + 0x140) =
                             *local_12c0.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start;
                        *(byte *)((long)aBorderAgent + 0x171) =
                             *(byte *)((long)aBorderAgent + 0x171) | 0x20;
                        bVar22 = false;
                      }
                      else {
                        ::fmt::v10::detail::
                        check_format_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                                  ();
                        utils::Hex_abi_cxx11_(&local_1348,(utils *)&local_12c0,aBytes_03);
                        local_12e8 = (undefined1  [8])local_1348._M_dataplus._M_p;
                        pcStack_12e0 = (char *)local_1348._M_string_length;
                        local_12d8._M_allocated_capacity = (size_type)local_1268;
                        local_12d8._8_8_ = pcStack_1260;
                        fmt_06.size_ = 0xdd;
                        fmt_06.data_ = (char *)0x33;
                        args_07.field_1.args_ = aVar19.args_;
                        args_07.desc_ = (unsigned_long_long)local_12e8;
                        ::fmt::v10::vformat_abi_cxx11_
                                  ((string *)local_1370,
                                   (v10 *)"[mDNS] value of TXT Key \'sq\' is invalid: {} from {}",
                                   fmt_06,args_07);
                        local_1328._0_4_ = 8;
                        pcStack_1320 = local_1318._M_local_buf + 8;
                        std::__cxx11::string::_M_construct<char*>
                                  ((string *)&pcStack_1320,local_1370._0_8_,
                                   (char *)(local_1370._0_8_ +
                                           CONCAT44(local_1370._12_4_,local_1370._8_4_)));
                        *(undefined4 *)((long)aBorderAgent + 0x178) = local_1328._0_4_;
                        std::__cxx11::string::operator=(local_12f0,(string *)&pcStack_1320);
                        if (pcStack_1320 != local_1318._M_local_buf + 8) {
                          operator_delete(pcStack_1320);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_1370._0_8_ != &local_1360) {
                          operator_delete((void *)local_1370._0_8_);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_1348._M_dataplus._M_p != &local_1348.field_2) {
                          operator_delete(local_1348._M_dataplus._M_p);
                        }
                        bVar22 = true;
                      }
                      bVar23 = lVar18 == 1;
                    }
LAB_002857bb:
                    if (bVar23) goto LAB_00285bff;
                    goto LAB_00285c02;
                  }
                  uVar7 = 0x400;
                  std::__cxx11::string::_M_assign(local_1220);
                }
              }
            }
            goto LAB_00285bee;
          }
          local_11f8 = (long)local_12c0.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_12c0.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start;
          if (local_11f8 == 4) {
            uVar14 = local_12c0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start[3] & 7;
            uVar3 = (ushort)*(undefined4 *)((long)aBorderAgent + 0x68);
            *(ushort *)((long)aBorderAgent + 0x68) = uVar3 & 0xfff8 | uVar14;
            uVar15 = local_12c0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start[3] & 0x18;
            *(ushort *)((long)aBorderAgent + 0x68) = uVar3 & 0xffe0 | uVar14 | uVar15;
            uVar16 = local_12c0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start[3] & 0x60;
            *(ushort *)((long)aBorderAgent + 0x68) = uVar3 & 0xff80 | uVar14 | uVar15 | uVar16;
            bVar2 = local_12c0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start[3];
            *(ushort *)((long)aBorderAgent + 0x68) =
                 uVar3 & 0xff00 | uVar14 | uVar15 | uVar16 | bVar2 & 0xff80;
            *(ushort *)((long)aBorderAgent + 0x68) =
                 uVar3 & 0xfe00 | uVar14 | uVar15 | uVar16 | bVar2 & 0xff80 |
                 (local_12c0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start[2] & 1) << 8;
            *(byte *)((long)aBorderAgent + 0x170) = *(byte *)((long)aBorderAgent + 0x170) | 8;
            bVar22 = false;
          }
          else {
            local_1328 = (undefined1  [8])0xd0000000d;
            pcVar20 = "value of TXT Key \'sb\' is invalid: value={} from {}";
            pcStack_1320 = "value of TXT Key \'sb\' is invalid: value={} from {}";
            local_1318._M_allocated_capacity = 0x32;
            local_1318._8_8_ = 0x200000000;
            local_1300 = ::fmt::v10::detail::
                         parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
            ;
            local_12f8 = ::fmt::v10::detail::
                         parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
            ;
            pBVar17 = extraout_RDX_00;
            local_1348._M_dataplus._M_p = (pointer)local_1328;
            local_1308 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)local_1328;
            do {
              if (pcVar20 == "") break;
              pcVar13 = pcVar20;
              if (*pcVar20 == '{') {
LAB_00285934:
                ::fmt::v10::detail::
                parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::writer::operator()((writer *)&local_1348,pcVar20,pcVar13);
                pcVar20 = ::fmt::v10::detail::
                          parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string,std::__cxx11::string>&>
                                    (pcVar13,"",
                                     (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)local_1328);
                bVar22 = true;
                pBVar17 = extraout_RDX_03;
              }
              else {
                pcVar13 = pcVar20 + 1;
                bVar22 = pcVar13 != "";
                if (bVar22) {
                  if (*pcVar13 != '{') {
                    pcVar21 = pcVar20 + 2;
                    do {
                      pcVar13 = pcVar21;
                      bVar22 = pcVar13 != "";
                      if (pcVar13 == "") goto LAB_00285930;
                      pcVar21 = pcVar13 + 1;
                    } while (*pcVar13 != '{');
                  }
                  bVar22 = true;
                }
LAB_00285930:
                if (bVar22) goto LAB_00285934;
                ::fmt::v10::detail::
                parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::writer::operator()((writer *)&local_1348,pcVar20,"");
                bVar22 = false;
                pBVar17 = extraout_RDX_04;
              }
            } while (bVar22);
            utils::Hex_abi_cxx11_(&local_1348,(utils *)&local_12c0,pBVar17);
            local_1328 = (undefined1  [8])local_1348._M_dataplus._M_p;
            pcStack_1320 = (char *)local_1348._M_string_length;
            local_1318._M_allocated_capacity = (size_type)local_1268;
            local_1318._8_8_ = pcStack_1260;
            fmt_01.size_ = 0xdd;
            fmt_01.data_ = (char *)0x32;
            args_02.field_1.args_ = aVar19.args_;
            args_02.desc_ = (unsigned_long_long)local_1328;
            ::fmt::v10::vformat_abi_cxx11_
                      ((string *)local_1370,
                       (v10 *)"value of TXT Key \'sb\' is invalid: value={} from {}",fmt_01,args_02)
            ;
            local_12e8._0_4_ = 8;
            pcStack_12e0 = local_12d8._M_local_buf + 8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&pcStack_12e0,local_1370._0_8_,
                       (char *)(local_1370._0_8_ + CONCAT44(local_1370._12_4_,local_1370._8_4_)));
            *(undefined4 *)((long)aBorderAgent + 0x178) = local_12e8._0_4_;
            std::__cxx11::string::operator=(local_12f0,(string *)&pcStack_12e0);
            if (pcStack_12e0 != local_12d8._M_local_buf + 8) {
              operator_delete(pcStack_12e0);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1370._0_8_ != &local_1360) {
              operator_delete((void *)local_1370._0_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1348._M_dataplus._M_p != &local_1348.field_2) {
              operator_delete(local_1348._M_dataplus._M_p);
            }
            bVar22 = true;
          }
          if (local_11f8 == 4) goto LAB_00285bff;
        }
LAB_00285c02:
        if (local_12c0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (uint8_t *)0x0) {
          operator_delete(local_12c0.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_12a8._M_dataplus._M_p != &local_12a8.field_2) {
          operator_delete(local_12a8._M_dataplus._M_p);
        }
        if (local_1288.handler_ != (format_string_checker<char> *)local_1278) {
          operator_delete(local_1288.handler_);
        }
        if (bVar22) {
          if ((local_1349 & 1) != 0) goto LAB_00286732;
          break;
        }
        uVar9 = local_11e0 + 1;
        bVar22 = uVar9 < local_11e8;
      } while (uVar9 != local_11e8);
    }
  }
  else {
    if (aType == 0x1c) {
      local_1288.handler_ = (format_string_checker<char> *)local_1278;
      local_1280 = 0;
      local_1278[0] = none_type;
      mdns_record_parse_aaaa(aData,aSize,aOffset,aLength,(sockaddr_in6 *)local_1370);
      local_1038._16_4_ = local_1360._M_allocated_capacity._0_4_;
      local_1038._20_4_ = (undefined4)local_1360._4_8_;
      lStack_1020._0_4_ = (undefined4)((ulong)local_1360._4_8_ >> 0x20);
      local_1038._0_8_ = local_1370._0_8_;
      local_1038._8_4_ = local_1370._8_4_;
      local_1038._12_4_ = local_1370._12_4_;
      Address::Set((Error *)local_1328,&local_1248,(sockaddr_storage *)local_1038);
      iVar6 = local_1328._0_4_;
      if (pcStack_1320 != local_1318._M_local_buf + 8) {
        operator_delete(pcStack_1320);
      }
      if (iVar6 != 0) {
        local_1328._0_4_ = 0xd;
        pcVar20 = "invalid IPv6 address in AAAA record from {}";
        pcStack_1320 = "invalid IPv6 address in AAAA record from {}";
        local_1318._M_allocated_capacity = 0x2b;
        local_1318._8_8_ = (char *)0x100000000;
        local_1300 = ::fmt::v10::detail::
                     parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
        ;
        local_1348._M_dataplus._M_p = (pointer)local_1328;
        local_1308 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_1328;
        do {
          if (pcVar20 == "") break;
          pcVar13 = pcVar20;
          if (*pcVar20 == '{') {
LAB_00286389:
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::writer::operator()((writer *)&local_1348,pcVar20,pcVar13);
            pcVar20 = ::fmt::v10::detail::
                      parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                                (pcVar13,"",
                                 (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)local_1328);
            bVar22 = true;
          }
          else {
            pcVar13 = pcVar20 + 1;
            bVar22 = pcVar13 != "";
            if (bVar22) {
              if (*pcVar13 != '{') {
                pcVar21 = pcVar20 + 2;
                do {
                  pcVar13 = pcVar21;
                  bVar22 = pcVar13 != "";
                  if (pcVar13 == "") goto LAB_00286385;
                  pcVar21 = pcVar13 + 1;
                } while (*pcVar13 != '{');
              }
              bVar22 = true;
            }
LAB_00286385:
            if (bVar22) goto LAB_00286389;
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::writer::operator()((writer *)&local_1348,pcVar20,"");
            bVar22 = false;
          }
        } while (bVar22);
        local_1328 = (undefined1  [8])local_1268;
        pcStack_1320 = pcStack_1260;
        fmt_08.size_ = 0xd;
        fmt_08.data_ = (char *)0x2b;
        args_09.field_1.args_ = aVar19.args_;
        args_09.desc_ = (unsigned_long_long)local_1328;
        ::fmt::v10::vformat_abi_cxx11_
                  (&local_12a8,(v10 *)"invalid IPv6 address in AAAA record from {}",fmt_08,args_09);
        local_12e8._0_4_ = 8;
        pcStack_12e0 = local_12d8._M_local_buf + 8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&pcStack_12e0,local_12a8._M_dataplus._M_p,
                   (char *)(local_12a8._M_string_length + (long)local_12a8._M_dataplus._M_p));
        goto LAB_002865d9;
      }
      Address::ToString_abi_cxx11_((string *)local_1328,&local_1248);
      std::__cxx11::string::operator=((string *)&local_1288,(string *)local_1328);
      if (local_1328 != (undefined1  [8])&local_1318) {
        operator_delete((void *)local_1328);
      }
      std::__cxx11::string::_M_assign((string *)((long)aBorderAgent + 8));
LAB_002866df:
      *(byte *)((long)aBorderAgent + 0x170) = *(byte *)((long)aBorderAgent + 0x170) | 1;
      goto LAB_002866ee;
    }
    if (aType == 0x21) {
      mdns_record_parse_srv
                ((mdns_record_srv_t *)local_1038,aData,aSize,aOffset,aLength,local_11b8,0x100);
      *(undefined2 *)((long)aBorderAgent + 0x28) = local_1038._4_2_;
      *(byte *)((long)aBorderAgent + 0x170) = *(byte *)((long)aBorderAgent + 0x170) | 2;
    }
  }
  if (*(int *)((long)aBorderAgent + 0x170) != 0) {
    tVar12 = time((time_t *)0x0);
    *(time_t *)((long)aBorderAgent + 0x168) = tVar12;
    *(byte *)((long)aBorderAgent + 0x172) = *(byte *)((long)aBorderAgent + 0x172) | 2;
  }
LAB_00286732:
  if (local_11d8 != local_11c8) {
    operator_delete(local_11d8);
  }
  if (local_1268 != &local_1258) {
    operator_delete(local_1268);
  }
  if (local_1248.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1248.mBytes.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int HandleRecord(const struct sockaddr *aFrom,
                 mdns_entry_type_t      aEntry,
                 uint16_t               aType,
                 uint16_t               aRclass,
                 uint32_t               aTtl,
                 const void            *aData,
                 size_t                 aSize,
                 size_t                 aOffset,
                 size_t                 aLength,
                 void                  *aBorderAgent)
{
    struct sockaddr_storage fromAddrStorage;
    Address                 fromAddr;
    std::string             fromAddrStr;
    std::string             entryType;
    char                    nameBuffer[256];

    BorderAgentOrErrorMsg &borderAgentOrErrorMsg = *reinterpret_cast<BorderAgentOrErrorMsg *>(aBorderAgent);
    BorderAgent           &borderAgent           = borderAgentOrErrorMsg.mBorderAgent;
    Error                 &error                 = borderAgentOrErrorMsg.mError;

    (void)aRclass;
    (void)aTtl;

    *reinterpret_cast<struct sockaddr *>(&fromAddrStorage) = *aFrom;
    if (fromAddr.Set(fromAddrStorage) != ErrorCode::kNone)
    {
        ExitNow(error = ERROR_BAD_FORMAT("invalid source address of mDNS response"));
    }

    fromAddrStr = fromAddr.ToString();

    entryType = (aEntry == MDNS_ENTRYTYPE_ANSWER) ? "answer"
                                                  : ((aEntry == MDNS_ENTRYTYPE_AUTHORITY) ? "authority" : "additional");
    if (aType == MDNS_RECORDTYPE_PTR)
    {
        mdns_string_t nameStr = mdns_record_parse_ptr(aData, aSize, aOffset, aLength, nameBuffer, sizeof(nameBuffer));
        borderAgent.mServiceName  = std::string(nameStr.str, nameStr.length);
        borderAgent.mPresentFlags = BorderAgent::kServiceNameBit;
        // TODO(wgtdkp): add debug logging.
    }
    else if (aType == MDNS_RECORDTYPE_SRV)
    {
        mdns_record_srv_t server =
            mdns_record_parse_srv(aData, aSize, aOffset, aLength, nameBuffer, sizeof(nameBuffer));

        borderAgent.mPort = server.port;
        borderAgent.mPresentFlags |= BorderAgent::kPortBit;
    }
    else if (aType == MDNS_RECORDTYPE_A)
    {
        struct sockaddr_storage addrStorage;
        struct sockaddr_in      addr;
        std::string             addrStr;

        mdns_record_parse_a(aData, aSize, aOffset, aLength, &addr);

        *reinterpret_cast<struct sockaddr_in *>(&addrStorage) = addr;
        if (fromAddr.Set(addrStorage) != ErrorCode::kNone)
        {
            ExitNow(error = ERROR_BAD_FORMAT("invalid IPv4 address in A record from {}", fromAddrStr));
        }

        addrStr = fromAddr.ToString();

        // We prefer AAAA (IPv6) address than A (IPv4) address.
        if (!(borderAgent.mPresentFlags & BorderAgent::kAddrBit))
        {
            borderAgent.mAddr = addrStr;
            borderAgent.mPresentFlags |= BorderAgent::kAddrBit;
        }
    }
    else if (aType == MDNS_RECORDTYPE_AAAA)
    {
        struct sockaddr_storage addrStorage;
        struct sockaddr_in6     addr;
        std::string             addrStr;

        mdns_record_parse_aaaa(aData, aSize, aOffset, aLength, &addr);

        *reinterpret_cast<struct sockaddr_in6 *>(&addrStorage) = addr;
        if (fromAddr.Set(addrStorage) != ErrorCode::kNone)
        {
            ExitNow(error = ERROR_BAD_FORMAT("invalid IPv6 address in AAAA record from {}", fromAddrStr));
        }

        addrStr = fromAddr.ToString();

        borderAgent.mAddr = addrStr;
        borderAgent.mPresentFlags |= BorderAgent::kAddrBit;
    }
    else if (aType == MDNS_RECORDTYPE_TXT)
    {
        mdns_record_txt_t txtBuffer[128];
        size_t            parsed;

        parsed = mdns_record_parse_txt(aData, aSize, aOffset, aLength, txtBuffer,
                                       sizeof(txtBuffer) / sizeof(mdns_record_txt_t));

        for (size_t i = 0; i < parsed; ++i)
        {
            auto key         = ToString(txtBuffer[i].key);
            auto value       = ToString(txtBuffer[i].value);
            auto binaryValue = ToByteArray(txtBuffer[i].value);

            if (key == "rv")
            {
                VerifyOrExit(value == "1", error = ERROR_BAD_FORMAT("value of TXT Key 'rv' is {} but not 1 from {}",
                                                                    value, fromAddrStr));
            }
            else if (key == "dd")
            {
                auto &discriminator = binaryValue;

                if (discriminator.size() != kExtendedAddrLength)
                {
                    ExitNow(error = ERROR_BAD_FORMAT("value of TXT Key 'dd' is invalid: value={}",
                                                     utils::Hex(discriminator)));
                }
                else
                {
                    borderAgent.mDiscriminator = discriminator;
                    borderAgent.mPresentFlags |= BorderAgent::kDiscriminatorBit;
                }
            }
            else if (key == "tv")
            {
                borderAgent.mThreadVersion = value;
                borderAgent.mPresentFlags |= BorderAgent::kThreadVersionBit;
            }
            else if (key == "sb")
            {
                auto &bitmap = binaryValue;
                if (bitmap.size() != 4)
                {
                    ExitNow(error = ERROR_BAD_FORMAT("value of TXT Key 'sb' is invalid: value={} from {}",
                                                     utils::Hex(bitmap), fromAddrStr));
                }

                borderAgent.mState.mConnectionMode = (bitmap[3] & 0x07);
                borderAgent.mState.mThreadIfStatus = (bitmap[3] & 0x18) >> 3;
                borderAgent.mState.mAvailability   = (bitmap[3] & 0x60) >> 5;
                borderAgent.mState.mBbrIsActive    = (bitmap[3] & 0x80) >> 7;
                borderAgent.mState.mBbrIsPrimary   = (bitmap[2] & 0x01);
                borderAgent.mPresentFlags |= BorderAgent::kStateBit;
            }
            else if (key == "nn")
            {
                borderAgent.mNetworkName = value;
                borderAgent.mPresentFlags |= BorderAgent::kNetworkNameBit;
            }
            else if (key == "xp")
            {
                auto &extendPanId = binaryValue;
                if (extendPanId.size() != 8)
                {
                    ExitNow(error = ERROR_BAD_FORMAT("value of TXT Key 'xp' is invalid: value={} from {}",
                                                     utils::Hex(extendPanId), fromAddrStr));
                }
                else
                {
                    borderAgent.mExtendedPanId = utils::Decode<uint64_t>(extendPanId);
                    borderAgent.mPresentFlags |= BorderAgent::kExtendedPanIdBit;
                }
            }
            else if (key == "vn")
            {
                borderAgent.mVendorName = value;
                borderAgent.mPresentFlags |= BorderAgent::kVendorNameBit;
            }
            else if (key == "mn")
            {
                borderAgent.mModelName = value;
                borderAgent.mPresentFlags |= BorderAgent::kModelNameBit;
            }
            else if (key == "at")
            {
                auto &activeTimestamp = binaryValue;
                if (activeTimestamp.size() != 8)
                {
                    ExitNow(error = ERROR_BAD_FORMAT("value of TXT Key 'at' is invalid: value={} from {}",
                                                     utils::Hex(activeTimestamp), fromAddrStr));
                }
                else
                {
                    borderAgent.mActiveTimestamp = Timestamp::Decode(utils::Decode<uint64_t>(activeTimestamp));
                    borderAgent.mPresentFlags |= BorderAgent::kActiveTimestampBit;
                }
            }
            else if (key == "pt")
            {
                auto &partitionId = binaryValue;
                if (partitionId.size() != 4)
                {
                    ExitNow(error = ERROR_BAD_FORMAT("value of TXT Key 'pt' is invalid: value={} from {}",
                                                     utils::Hex(partitionId), fromAddrStr));
                }
                else
                {
                    borderAgent.mPartitionId = utils::Decode<uint32_t>(partitionId);
                    borderAgent.mPresentFlags |= BorderAgent::kPartitionIdBit;
                }
            }
            else if (key == "vd")
            {
                borderAgent.mVendorData = value;
                borderAgent.mPresentFlags |= BorderAgent::kVendorDataBit;
            }
            else if (key == "vo")
            {
                auto &oui = binaryValue;
                if (oui.size() != 3)
                {
                    ExitNow(error = ERROR_BAD_FORMAT("value of TXT Key 'vo' is invalid: value={} from {}",
                                                     utils::Hex(oui), fromAddrStr));
                }
                else
                {
                    borderAgent.mVendorOui = oui;
                    borderAgent.mPresentFlags |= BorderAgent::kVendorOuiBit;
                }
            }
            else if (key == "dn")
            {
                borderAgent.mDomainName = value;
                borderAgent.mPresentFlags |= BorderAgent::kDomainNameBit;
            }
            else if (key == "sq")
            {
                auto &bbrSeqNum = binaryValue;
                if (bbrSeqNum.size() != 1)
                {
                    ExitNow(error = ERROR_BAD_FORMAT("[mDNS] value of TXT Key 'sq' is invalid: {} from {}",
                                                     utils::Hex(bbrSeqNum), fromAddrStr));
                }
                else
                {
                    borderAgent.mBbrSeqNumber = utils::Decode<uint8_t>(bbrSeqNum);
                    borderAgent.mPresentFlags |= BorderAgent::kBbrSeqNumberBit;
                }
            }
            else if (key == "bb")
            {
                auto &bbrPort = binaryValue;
                if (bbrPort.size() != 2)
                {
                    ExitNow(error = ERROR_BAD_FORMAT("[mDNS] value of TXT Key 'bb' is invalid: {} from {}",
                                                     utils::Hex(bbrPort), fromAddrStr));
                }
                else
                {
                    borderAgent.mBbrPort = utils::Decode<uint16_t>(bbrPort);
                    borderAgent.mPresentFlags |= BorderAgent::kBbrPortBit;
                }
            }
            else
            {
                // TODO(wgtdkp): add debug logging.
            }
        }
    }
    else
    {
        // TODO(wgtdkp): add debug logging.
    }

    if (borderAgent.mPresentFlags != 0)
    {
        // Actualize Timestamp
        borderAgent.mUpdateTimestamp.mTime = time(nullptr);
        borderAgent.mPresentFlags |= BorderAgent::kUpdateTimestampBit;
    }
exit:
    return 0;
}